

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::LoopLayerParams::Clear(LoopLayerParams *this)

{
  string *psVar1;
  
  psVar1 = (this->conditionvar_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  if (this->conditionnetwork_ != (NeuralNetwork *)0x0) {
    (*(this->conditionnetwork_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->conditionnetwork_ = (NeuralNetwork *)0x0;
  if (this->bodynetwork_ != (NeuralNetwork *)0x0) {
    (*(this->bodynetwork_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->bodynetwork_ = (NeuralNetwork *)0x0;
  this->maxloopiterations_ = 0;
  return;
}

Assistant:

void LoopLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LoopLayerParams)
  conditionvar_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && conditionnetwork_ != NULL) {
    delete conditionnetwork_;
  }
  conditionnetwork_ = NULL;
  if (GetArenaNoVirtual() == NULL && bodynetwork_ != NULL) {
    delete bodynetwork_;
  }
  bodynetwork_ = NULL;
  maxloopiterations_ = GOOGLE_ULONGLONG(0);
}